

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O0

void __thiscall ncnn::Convolution_x86_avx2::Convolution_x86_avx2(Convolution_x86_avx2 *this)

{
  long *in_RDI;
  Convolution *in_stack_fffffffffffffff0;
  
  Convolution::Convolution(in_stack_fffffffffffffff0);
  *in_RDI = (long)&PTR_create_pipeline_009952e8;
  in_RDI[0x30] = (long)&PTR__Convolution_x86_avx2_00995370;
  Mat::Mat((Mat *)(in_RDI + 2));
  Mat::Mat((Mat *)(in_RDI + 0xb));
  Mat::Mat((Mat *)(in_RDI + 0x14));
  Mat::Mat((Mat *)(in_RDI + 0x1e));
  Mat::Mat((Mat *)(in_RDI + 0x27));
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb) = 1;
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x11) = 1;
  in_RDI[1] = 0;
  in_RDI[0x1d] = 0;
  return;
}

Assistant:

Convolution_x86_avx2::Convolution_x86_avx2()
{
#if __SSE2__
    support_packing = true;
#if __AVX2__
    support_weight_fp16_storage = true;
#endif
#endif // __SSE2__

    activation = 0;
    convolution_dilation1 = 0;
}